

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O3

int sat_solver_add_xor(sat_solver *pSat,int iVarA,int iVarB,int iVarC,int fCompl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lit Lits [3];
  int local_3c;
  int local_38;
  int local_34;
  
  if ((iVarB | iVarA | iVarC) < 0) {
    __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  iVar4 = iVarA * 2 + 1;
  iVar1 = iVarB * 2 + 1;
  iVar2 = iVarC * 2 + 1;
  local_3c = iVar4;
  local_38 = iVar1;
  local_34 = iVar2;
  iVar3 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
  if (iVar3 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  local_3c = iVar4;
  local_38 = iVarB * 2;
  local_34 = iVarC * 2;
  iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
  if (iVar4 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  local_3c = iVarA * 2;
  local_38 = iVar1;
  local_34 = iVarC * 2;
  iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
  if (iVar4 != 0) {
    local_3c = iVarA * 2;
    local_38 = iVarB * 2;
    local_34 = iVar2;
    iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
    if (iVar4 != 0) {
      return iVar4;
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
}

Assistant:

static inline int sat_solver_add_xor( sat_solver * pSat, int iVarA, int iVarB, int iVarC, int fCompl )
{
    lit Lits[3];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 && iVarC >= 0 );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );
    return 4;
}